

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lyd_print_fd(int fd,lyd_node *root,LYD_FORMAT format,int options)

{
  undefined1 local_68 [8];
  lyout out;
  int r;
  int options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  int fd_local;
  
  if (fd < 0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_print_fd");
    root_local._4_4_ = 1;
  }
  else {
    memset(local_68,0,0x40);
    local_68._0_4_ = LYOUT_FD;
    out.type = fd;
    out.hole_count._4_4_ = lyd_print_((lyout *)local_68,root,format,options);
    free((void *)out.method.mem.size);
    root_local._4_4_ = out.hole_count._4_4_;
  }
  return root_local._4_4_;
}

Assistant:

API int
lyd_print_fd(int fd, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    int r;
    struct lyout out;

    if (fd < 0) {
        LOGARG;
        return EXIT_FAILURE;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_FD;
    out.method.fd = fd;

    r = lyd_print_(&out, root, format, options);

    free(out.buffered);
    return r;
}